

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_iterator_next
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,int magic)

{
  uint uVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  int iVar4;
  JSValue *pJVar5;
  JSValueUnion JVar6;
  JSValueUnion JVar7;
  ulong uVar8;
  int64_t iVar9;
  JSValue this_obj;
  JSValue v;
  JSValue v_00;
  JSValue JVar10;
  JSValue JVar11;
  JSValue prop;
  JSValue JVar12;
  uint32_t len;
  uint local_6c;
  JSValueUnion local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValue local_48;
  
  pJVar5 = (JSValue *)JS_GetOpaque2(ctx,this_val,0x25);
  if (pJVar5 == (JSValue *)0x0) goto LAB_0013cf55;
  if ((int)pJVar5->tag == 3) {
LAB_0013cefd:
    *pdone = 1;
    uVar8 = 3;
  }
  else {
    pvVar2 = (pJVar5->u).ptr;
    if ((ushort)(*(short *)((long)pvVar2 + 6) - 0x15U) < 9) {
      if (*(char *)(*(long *)(*(long *)(*(long *)((long)pvVar2 + 0x30) + 0x18) + 0x30) + 4) == '\0')
      {
        local_6c = *(uint *)((long)pvVar2 + 0x40);
LAB_0013cf86:
        uVar1 = *(uint *)((long)&pJVar5[1].u + 4);
        JVar7._4_4_ = 0;
        JVar7.int32 = uVar1;
        if (uVar1 < local_6c) {
          *(uint *)((long)&pJVar5[1].u + 4) = uVar1 + 1;
          *pdone = 0;
          if (pJVar5[1].u.int32 == 0) {
            JVar6.float64 = (double)JVar7.float64;
            if (-1 < (int)uVar1) {
              JVar6 = JVar7;
            }
            iVar9 = 7;
            if (-1 < (int)uVar1) {
              iVar9 = 0;
            }
            JVar11.tag = iVar9;
            JVar11.u.float64 = JVar6.float64;
            uVar8 = (ulong)JVar6.ptr & 0x7fffffff00000000;
          }
          else {
            local_68.float64 = (double)JVar7.float64;
            JVar6.float64 = local_68.float64;
            if (-1 < (int)uVar1) {
              JVar6 = JVar7;
            }
            iVar9 = 7;
            if (-1 < (int)uVar1) {
              iVar9 = 0;
            }
            this_obj.tag = pJVar5->tag;
            this_obj.u.ptr = (pJVar5->u).ptr;
            prop.tag = iVar9;
            prop.u.float64 = JVar6.float64;
            local_48 = JS_GetPropertyValue(ctx,this_obj,prop);
            v.tag = local_48.tag;
            local_60 = local_48.u;
            uVar8 = 0;
            JVar11 = (JSValue)(ZEXT816(6) << 0x40);
            if ((int)local_48.tag != 6) {
              if (pJVar5[1].u.int32 == 1) {
                uVar8 = (ulong)local_60.ptr & 0xffffffff00000000;
                JVar11 = local_48;
              }
              else {
                if (-1 < (int)uVar1) {
                  local_68 = JVar7;
                }
                iVar9 = 7;
                if (-1 < (int)uVar1) {
                  iVar9 = 0;
                }
                local_58 = local_68;
                local_50 = iVar9;
                JVar11 = js_create_array(ctx,2,(JSValue *)&local_58);
                v.u.ptr = local_60.ptr;
                JS_FreeValue(ctx,v);
                v_00.tag = iVar9;
                v_00.u.float64 = local_68.float64;
                JS_FreeValue(ctx,v_00);
                uVar8 = (ulong)JVar11.u.ptr & 0xffffffff00000000;
              }
            }
          }
          goto LAB_0013cf67;
        }
        local_58.ptr = (pJVar5->u).ptr;
        JVar12 = *pJVar5;
        if ((0xfffffff4 < (uint)pJVar5->tag) &&
           (iVar4 = *local_58.ptr, *(int *)local_58.ptr = iVar4 + -1, iVar4 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar12);
        }
        (pJVar5->u).int32 = 0;
        pJVar5->tag = 3;
        goto LAB_0013cefd;
      }
      JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
    }
    else {
      JVar12.tag = pJVar5->tag;
      JVar12.u.ptr = (pJVar5->u).ptr;
      iVar4 = js_get_length32(ctx,&local_6c,JVar12);
      if (iVar4 == 0) goto LAB_0013cf86;
    }
LAB_0013cf55:
    *pdone = 0;
    uVar8 = 6;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  uVar8 = 0;
  JVar11 = (JSValue)(auVar3 << 0x40);
LAB_0013cf67:
  JVar10.u.ptr = (void *)((ulong)JVar11.u.ptr & 0xffffffff | uVar8);
  JVar10.tag = JVar11.tag;
  return JVar10;
}

Assistant:

static JSValue js_array_iterator_next(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv,
                                      BOOL *pdone, int magic)
{
    JSArrayIteratorData *it;
    uint32_t len, idx;
    JSValue val, obj;
    JSObject *p;

    it = JS_GetOpaque2(ctx, this_val, JS_CLASS_ARRAY_ITERATOR);
    if (!it)
        goto fail1;
    if (JS_IsUndefined(it->obj))
        goto done;
    p = JS_VALUE_GET_OBJ(it->obj);
    if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
        p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
        if (typed_array_is_detached(ctx, p)) {
            JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
            goto fail1;
        }
        len = p->u.array.count;
    } else {
        if (js_get_length32(ctx, &len, it->obj)) {
        fail1:
            *pdone = FALSE;
            return JS_EXCEPTION;
        }
    }
    idx = it->idx;
    if (idx >= len) {
        JS_FreeValue(ctx, it->obj);
        it->obj = JS_UNDEFINED;
    done:
        *pdone = TRUE;
        return JS_UNDEFINED;
    }
    it->idx = idx + 1;
    *pdone = FALSE;
    if (it->kind == JS_ITERATOR_KIND_KEY) {
        return JS_NewUint32(ctx, idx);
    } else {
        val = JS_GetPropertyUint32(ctx, it->obj, idx);
        if (JS_IsException(val))
            return JS_EXCEPTION;
        if (it->kind == JS_ITERATOR_KIND_VALUE) {
            return val;
        } else {
            JSValueConst args[2];
            JSValue num;
            num = JS_NewUint32(ctx, idx);
            args[0] = num;
            args[1] = val;
            obj = js_create_array(ctx, 2, args);
            JS_FreeValue(ctx, val);
            JS_FreeValue(ctx, num);
            return obj;
        }
    }
}